

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txdb.cpp
# Opt level: O0

void __thiscall CCoinsViewDBCursor::Next(CCoinsViewDBCursor *this)

{
  long lVar1;
  bool bVar2;
  CoinEntry *in_RDI;
  long in_FS_OFFSET;
  CoinEntry entry;
  CDBIterator *in_stack_00000020;
  undefined1 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::operator->
            ((unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> *)in_RDI);
  CDBIterator::Next((CDBIterator *)in_RDI);
  anon_unknown.dwarf_8f1072::CoinEntry::CoinEntry(in_RDI,(COutPoint *)0x75886b);
  std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::operator->
            ((unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> *)in_RDI);
  bVar2 = CDBIterator::Valid((CDBIterator *)in_RDI);
  if (bVar2) {
    std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::operator->
              ((unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> *)in_RDI);
    bVar2 = CDBIterator::GetKey<(anonymous_namespace)::CoinEntry>
                      (in_stack_00000020,(CoinEntry *)entry._8_8_);
    if (bVar2) {
      *(undefined1 *)&in_RDI[3].outpoint = local_10;
      goto LAB_007588b9;
    }
  }
  *(undefined1 *)&in_RDI[3].outpoint = 0;
LAB_007588b9:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CCoinsViewDBCursor::Next()
{
    pcursor->Next();
    CoinEntry entry(&keyTmp.second);
    if (!pcursor->Valid() || !pcursor->GetKey(entry)) {
        keyTmp.first = 0; // Invalidate cached key after last record so that Valid() and GetKey() return false
    } else {
        keyTmp.first = entry.key;
    }
}